

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::StreamingReporterBase::testCaseStarting(StreamingReporterBase *this,TestCaseInfo *_testInfo)

{
  char *this_00;
  Option<Catch::TestCaseInfo> local_100;
  
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_100.storage,_testInfo);
  local_100.nullableValue = (TestCaseInfo *)local_100.storage;
  Option<Catch::TestCaseInfo>::reset(&this->unusedTestCaseInfo);
  if (local_100.nullableValue != (TestCaseInfo *)0x0) {
    this_00 = (this->unusedTestCaseInfo).storage;
    TestCaseInfo::TestCaseInfo((TestCaseInfo *)this_00,local_100.nullableValue);
    (this->unusedTestCaseInfo).nullableValue = (TestCaseInfo *)this_00;
  }
  Option<Catch::TestCaseInfo>::reset(&local_100);
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& _testInfo ) {
            unusedTestCaseInfo = _testInfo;
        }